

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-slays.c
# Opt level: O0

void learn_brand_slay_helper
               (player *p,object *obj1,object *obj2,monster *mon,_Bool allow_off,_Bool allow_temp)

{
  bool bVar1;
  brand_conflict *pbVar2;
  _Bool _Var3;
  monster_lore_conflict *lore_00;
  object *poVar4;
  slay_conflict *slay;
  object *obj_1;
  _Bool learn_1;
  slay_conflict *s;
  wchar_t j_1;
  object *obj;
  _Bool learn;
  brand_conflict *b;
  wchar_t j;
  wchar_t i;
  monster_lore *lore;
  _Bool allow_temp_local;
  _Bool allow_off_local;
  monster *mon_local;
  object *obj2_local;
  object *obj1_local;
  player *p_local;
  
  lore_00 = get_lore(mon->race);
  for (b._4_4_ = L'\x01'; b._4_4_ < (int)(uint)z_info->brand_max; b._4_4_ = b._4_4_ + L'\x01') {
    bVar1 = false;
    if (((obj1 != (object *)0x0) && (obj1->brands != (_Bool *)0x0)) &&
       ((obj1->brands[b._4_4_] & 1U) != 0)) {
      bVar1 = true;
    }
    if (((obj2 != (object *)0x0) && (obj2->brands != (_Bool *)0x0)) &&
       ((obj2->brands[b._4_4_] & 1U) != 0)) {
      bVar1 = true;
    }
    if (allow_off) {
      for (b._0_4_ = L'\0'; (wchar_t)b < (int)(uint)(p->body).count; b._0_4_ = (wchar_t)b + L'\x01')
      {
        poVar4 = slot_object(p,(wchar_t)b);
        if (((poVar4 != (object *)0x0) && (poVar4->brands != (_Bool *)0x0)) &&
           (((poVar4->brands[b._4_4_] & 1U) != 0 &&
            ((_Var3 = tval_is_weapon(poVar4), !_Var3 && (_Var3 = tval_is_launcher(poVar4), !_Var3)))
            ))) {
          bVar1 = true;
        }
      }
    }
    if ((bVar1) || ((allow_temp && (_Var3 = player_has_temporary_brand(p,b._4_4_), _Var3)))) {
      pbVar2 = brands;
      if ((brands[b._4_4_].resist_flag == 0) ||
         (_Var3 = flag_has_dbg(mon->race->flags,0xc,brands[b._4_4_].resist_flag,"mon->race->flags",
                               "b->resist_flag"), !_Var3)) {
        if (bVar1) {
          player_learn_brand(p,b._4_4_);
        }
        if (pbVar2[b._4_4_].resist_flag != 0) {
          lore_learn_flag_if_visible(lore_00,mon,pbVar2[b._4_4_].resist_flag);
        }
        if (pbVar2[b._4_4_].vuln_flag != 0) {
          lore_learn_flag_if_visible(lore_00,mon,pbVar2[b._4_4_].vuln_flag);
        }
      }
      else {
        _Var3 = player_knows_brand(p,b._4_4_);
        if (_Var3) {
          lore_learn_flag_if_visible(lore_00,mon,pbVar2[b._4_4_].resist_flag);
        }
      }
    }
  }
  for (b._4_4_ = L'\x01'; b._4_4_ < (int)(uint)z_info->slay_max; b._4_4_ = b._4_4_ + L'\x01') {
    bVar1 = false;
    if (((obj1 != (object *)0x0) && (obj1->slays != (_Bool *)0x0)) &&
       ((obj1->slays[b._4_4_] & 1U) != 0)) {
      bVar1 = true;
    }
    if (((obj2 != (object *)0x0) && (obj2->slays != (_Bool *)0x0)) &&
       ((obj2->slays[b._4_4_] & 1U) != 0)) {
      bVar1 = true;
    }
    if (allow_off) {
      for (s._4_4_ = L'\0'; s._4_4_ < (int)(uint)(p->body).count; s._4_4_ = s._4_4_ + L'\x01') {
        poVar4 = slot_object(p,s._4_4_);
        if (((poVar4 != (object *)0x0) && (poVar4->slays != (_Bool *)0x0)) &&
           (((poVar4->slays[b._4_4_] & 1U) != 0 &&
            ((_Var3 = tval_is_weapon(poVar4), !_Var3 && (_Var3 = tval_is_launcher(poVar4), !_Var3)))
            ))) {
          bVar1 = true;
        }
      }
    }
    if ((bVar1) || ((allow_temp && (_Var3 = player_has_temporary_slay(p,b._4_4_), _Var3)))) {
      slay = slays + b._4_4_;
      _Var3 = react_to_specific_slay(slay,mon);
      if (_Var3) {
        if (slay->race_flag != 0) {
          lore_learn_flag_if_visible(lore_00,mon,slay->race_flag);
        }
        _Var3 = monster_is_visible(mon);
        if ((_Var3) && (bVar1)) {
          player_learn_slay(p,b._4_4_);
        }
      }
      else {
        _Var3 = player_knows_slay(p,b._4_4_);
        if ((_Var3) && (slay->race_flag != 0)) {
          lore_learn_flag_if_visible(lore_00,mon,slay->race_flag);
        }
      }
    }
  }
  return;
}

Assistant:

static void learn_brand_slay_helper(struct player *p, struct object *obj1,
		struct object *obj2, const struct monster *mon, bool allow_off,
		bool allow_temp)
{
	struct monster_lore *lore = get_lore(mon->race);
	int i;

	/* Handle brands. */
	for (i = 1; i < z_info->brand_max; i++) {
		int j;
		struct brand *b;
		bool learn = false;

		/* Check the objects directly involved. */
		if (obj1 && obj1->brands && obj1->brands[i]) {
			learn = true;
		}
		if (obj2 && obj2->brands && obj2->brands[i]) {
			learn = true;
		}

		/* Check for an off-weapon brand. */
		if (allow_off) {
			for (j = 0; j < p->body.count; ++j) {
				struct object *obj = slot_object(p, j);

				if (obj && obj->brands && obj->brands[i]
						&& !tval_is_weapon(obj)
						&& !tval_is_launcher(obj)) {
					learn = true;
				}
			}
		}

		/*
		 * Check for the temporary brand (only relevant if the brand
		 * is not already present).
		 */
		if (!learn && !(allow_temp && player_has_temporary_brand(p, i))) {
			continue;
		}

		b = &brands[i];
		if (!b->resist_flag || !rf_has(mon->race->flags, b->resist_flag)) {
			/* Learn the brand */
			if (learn) {
				player_learn_brand(p, i);
			}

			/* Learn about the monster. */
			if (b->resist_flag) {
				lore_learn_flag_if_visible(lore, mon,
					b->resist_flag);
			}
			if (b->vuln_flag) {
				lore_learn_flag_if_visible(lore, mon,
					b->vuln_flag);
			}
		} else if (player_knows_brand(p, i)) {
			/* Learn about the monster. */
			lore_learn_flag_if_visible(lore, mon, b->resist_flag);
		}
	}

	/* Handle slays. */
	for (i = 1; i < z_info->slay_max; ++i) {
		int j;
		struct slay *s;
		bool learn = false;

		/* Check the objects directly involved. */
		if (obj1 && obj1->slays && obj1->slays[i]) {
			learn = true;
		}
		if (obj2 && obj2->slays && obj2->slays[i]) {
			learn = true;
		}

		/* Check for an off-weapon slay. */
		if (allow_off) {
			for (j = 0; j < p->body.count; ++j) {
				struct object *obj = slot_object(p, j);

				if (obj && obj->slays && obj->slays[i]
						&& !tval_is_weapon(obj)
						&& !tval_is_launcher(obj)) {
					learn = true;
				}
			}
		}

		/*
		 * Check for the temporary slay (only relevant if the slay
		 * is not already present.
		 */
		if (!learn && !(allow_temp && player_has_temporary_slay(p, i))) {
			continue;
		}

		s = &slays[i];
		if (react_to_specific_slay(s, mon)) {
			/* Learn about the monster. */
			if (s->race_flag) {
				lore_learn_flag_if_visible(lore, mon,
					s->race_flag);
			}
			if (monster_is_visible(mon)) {
				/* Learn the slay */
				if (learn) {
					player_learn_slay(p, i);
				}
			}
		} else if (player_knows_slay(p, i)) {
			/* Learn about unaffected monsters. */
			if (s->race_flag) {
				lore_learn_flag_if_visible(lore, mon,
					s->race_flag);
			}
		}
	}
}